

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O2

QPointF roundInDeviceCoordinates(QPointF *p,QTransform *m)

{
  QPoint QVar1;
  long in_FS_OFFSET;
  QPointF QVar2;
  QPointF local_90;
  QPointF local_80;
  QTransform local_70;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QTransform::inverted(&local_70,m,(bool *)0x0);
  local_90 = QTransform::map(m,p);
  QVar1 = QPointF::toPoint(&local_90);
  local_80.xp = (qreal)QVar1.xp.m_i.m_i;
  local_80.yp = (qreal)QVar1.yp.m_i.m_i;
  QVar2 = QTransform::map(&local_70,&local_80);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

static inline QPointF roundInDeviceCoordinates(const QPointF &p, const QTransform &m)
{
    return m.inverted().map(QPointF(m.map(p).toPoint()));
}